

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O2

size_t cmd_list_lookup_by_name(char *name)

{
  int iVar1;
  size_t sVar2;
  command_list *pcVar3;
  size_t sVar4;
  
  pcVar3 = cmds_all;
  sVar4 = 0;
  while ((sVar2 = 0xfffffffffffffffe, sVar4 != 0x11 &&
         (iVar1 = strcmp(pcVar3->name,name), sVar2 = sVar4, iVar1 != 0))) {
    sVar4 = sVar4 + 1;
    pcVar3 = pcVar3 + 1;
  }
  return sVar2;
}

Assistant:

size_t cmd_list_lookup_by_name(const char *name)
{
	size_t i = 0;

	while (1) {
		if (i >= (int) N_ELEMENTS(cmds_all)) {
			/*
			 * Return a negative value other than -1 to prevent
			 * future lookups for the same name by ui-context.c.
			 * Those lookups are guaranteed to fail since the
			 * names in cmds_all don't change.
			 */
			return -2;
		}
		if (streq(cmds_all[i].name, name)) {
			return i;
		}
		++i;
	}
}